

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O0

bool cmInstallCommandArguments::CheckPermissions(string *onePermission,string *permissions)

{
  bool bVar1;
  char **local_28;
  char **valid;
  string *permissions_local;
  string *onePermission_local;
  
  local_28 = PermissionsTable;
  while( true ) {
    if (*local_28 == (char *)0x0) {
      return false;
    }
    bVar1 = std::operator==(onePermission,*local_28);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  std::__cxx11::string::operator+=((string *)permissions," ");
  std::__cxx11::string::operator+=((string *)permissions,(string *)onePermission);
  return true;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions(
  const std::string& onePermission, std::string& permissions)
{
  // Check the permission against the table.
  for (const char** valid = cmInstallCommandArguments::PermissionsTable;
       *valid; ++valid) {
    if (onePermission == *valid) {
      // This is a valid permission.
      permissions += " ";
      permissions += onePermission;
      return true;
    }
  }
  // This is not a valid permission.
  return false;
}